

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::StartsWithOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  undefined8 local_80;
  void *local_78;
  undefined8 local_70;
  void *local_68;
  string_t *local_60;
  bool *local_58;
  ulong local_50;
  ulong local_48;
  unsigned_long *local_40;
  ulong local_38;
  
  local_40 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_60 = rdata;
  local_58 = result_data;
  local_48 = count;
  if (local_40 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar10 = 8;
      iVar7 = 0;
      local_40 = (unsigned_long *)0x0;
      do {
        local_70 = *(undefined8 *)((long)ldata + lVar10 + -8);
        local_68 = *(void **)((long)&ldata->value + lVar10);
        local_80 = *(ulong *)((long)rdata + lVar10 + -8);
        local_78 = *(void **)((long)&rdata->value + lVar10);
        pvVar5 = local_68;
        if ((uint)local_70 < 0xd) {
          pvVar5 = (void *)((long)&local_70 + 4);
        }
        pvVar4 = local_78;
        if ((local_80 & 0xffffffff) < 0xd) {
          pvVar4 = (void *)((long)&local_80 + 4);
        }
        if ((local_80 & 0xffffffff) == 0) {
          bVar12 = true;
        }
        else if ((uint)local_70 < (uint)local_80) {
          bVar12 = false;
        }
        else {
          iVar1 = bcmp(pvVar5,pvVar4,local_80 & 0xffffffff);
          bVar12 = iVar1 == 0;
          rdata = local_60;
        }
        local_58[iVar7] = bVar12;
        iVar7 = iVar7 + 1;
        lVar10 = lVar10 + 0x10;
      } while (local_48 != iVar7);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    local_38 = 0;
    uVar8 = 0;
    do {
      uVar2 = local_40[local_38];
      uVar6 = uVar8 + 0x40;
      if (local_48 <= uVar8 + 0x40) {
        uVar6 = local_48;
      }
      uVar9 = uVar6;
      if (uVar2 != 0) {
        uVar9 = uVar8;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar8 < uVar6) {
            uVar2 = uVar8 << 4 | 8;
            do {
              local_70 = *(undefined8 *)((long)ldata + (uVar2 - 8));
              local_68 = *(void **)((long)&ldata->value + uVar2);
              local_80 = *(ulong *)((long)rdata + (uVar2 - 8));
              local_78 = *(void **)((long)&rdata->value + uVar2);
              pvVar5 = local_68;
              if ((uint)local_70 < 0xd) {
                pvVar5 = (void *)((long)&local_70 + 4);
              }
              pvVar4 = local_78;
              if ((local_80 & 0xffffffff) < 0xd) {
                pvVar4 = (void *)((long)&local_80 + 4);
              }
              if ((local_80 & 0xffffffff) == 0) {
                bVar12 = true;
              }
              else if ((uint)local_70 < (uint)local_80) {
                bVar12 = false;
              }
              else {
                iVar1 = bcmp(pvVar5,pvVar4,local_80 & 0xffffffff);
                bVar12 = iVar1 == 0;
                rdata = local_60;
              }
              local_58[uVar8] = bVar12;
              uVar8 = uVar8 + 1;
              uVar2 = uVar2 + 0x10;
              uVar9 = uVar8;
            } while (uVar6 != uVar8);
          }
        }
        else if (uVar8 < uVar6) {
          uVar3 = uVar8 << 4 | 8;
          uVar11 = 0;
          do {
            if ((uVar2 >> (uVar11 & 0x3f) & 1) != 0) {
              local_70 = *(undefined8 *)((long)ldata + (uVar3 - 8));
              local_68 = *(void **)((long)&ldata->value + uVar3);
              local_80 = *(ulong *)((long)rdata + (uVar3 - 8));
              local_78 = *(void **)((long)&rdata->value + uVar3);
              pvVar5 = local_68;
              if ((uint)local_70 < 0xd) {
                pvVar5 = (void *)((long)&local_70 + 4);
              }
              pvVar4 = local_78;
              if ((local_80 & 0xffffffff) < 0xd) {
                pvVar4 = (void *)((long)&local_80 + 4);
              }
              if ((local_80 & 0xffffffff) == 0) {
                bVar12 = true;
              }
              else if ((uint)local_70 < (uint)local_80) {
                bVar12 = false;
              }
              else {
                iVar1 = bcmp(pvVar5,pvVar4,local_80 & 0xffffffff);
                bVar12 = iVar1 == 0;
                rdata = local_60;
              }
              local_58[uVar8] = bVar12;
            }
            uVar8 = uVar8 + 1;
            uVar3 = uVar3 + 0x10;
            uVar11 = uVar11 + 1;
            uVar9 = uVar8;
          } while (uVar6 != uVar8);
        }
      }
      local_38 = local_38 + 1;
      uVar8 = uVar9;
    } while (local_38 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}